

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptProxy::
HasPropertyTrap<Js::JavascriptProxy::HasItemQuery(unsigned_int)::__0,Js::JavascriptProxy::HasItemQuery(unsigned_int)::__1>
          (JavascriptProxy *this,anon_class_8_1_a81517f2 fn,anon_class_24_3_139dd0c7 getPropertyId)

{
  anon_class_40_5_39f35981 implicitCall;
  bool bVar1;
  PropertyId propertyId_00;
  BOOL BVar2;
  int iVar3;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  HostScriptContext *this_00;
  RecyclableObject *pRVar6;
  RecyclableObject *object;
  JavascriptFunction *function;
  Var pvVar7;
  undefined1 local_c0 [4];
  BOOL hasTargetProperty;
  PropertyDescriptor targetDescriptor;
  BOOL hasProperty;
  Var getHasResult;
  Var propertyName;
  PropertyId propertyId;
  JavascriptFunction *hasMethod;
  RecyclableObject *targetObj;
  RecyclableObject *handlerObj;
  ScriptContext *requestContext;
  ThreadContext *threadContext;
  JavascriptProxy *this_local;
  anon_class_8_1_a81517f2 fn_local;
  
  this_local = (JavascriptProxy *)fn.index;
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ThreadContext::ProbeStack(pTVar5,0xc00,pSVar4,(PVOID)0x0);
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  bVar1 = ThreadContext::IsDisableImplicitCall(pTVar5);
  if (bVar1) {
    ThreadContext::AddImplicitCallFlags(pTVar5,ImplicitCall_External);
    fn_local.index._4_4_ = 0;
  }
  else {
    this_00 = ThreadContext::GetPreviousHostScriptContext(pTVar5);
    pSVar4 = HostScriptContext::GetScriptContext(this_00);
    pRVar6 = MarshalHandler(this,pSVar4);
    if (pRVar6 == (RecyclableObject *)0x0) {
      bVar1 = ThreadContext::RecordImplicitException(pTVar5);
      if (bVar1) {
        JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ea15,L"has");
      }
      fn_local.index._4_4_ = 0;
    }
    else {
      object = MarshalTarget(this,pSVar4);
      function = GetMethodHelper(this,0xb4,pSVar4);
      if ((function == (JavascriptFunction *)0x0) ||
         (bVar1 = ScriptContext::IsHeapEnumInProgress(pSVar4), bVar1)) {
        fn_local.index._4_4_ =
             HasItemQuery::anon_class_8_1_a81517f2::operator()
                       ((anon_class_8_1_a81517f2 *)&this_local,object);
      }
      else {
        propertyId_00 = HasItemQuery::anon_class_24_3_139dd0c7::operator()(&getPropertyId);
        pvVar7 = GetName(pSVar4,propertyId_00);
        implicitCall.hasMethod = function;
        implicitCall.threadContext = pTVar5;
        implicitCall.handlerObj = pRVar6;
        implicitCall.targetObj = object;
        implicitCall.propertyName = pvVar7;
        pvVar7 = ThreadContext::
                 ExecuteImplicitCall<Js::JavascriptProxy::HasPropertyTrap<Js::JavascriptProxy::HasItemQuery(unsigned_int)::__0,Js::JavascriptProxy::HasItemQuery(unsigned_int)::__1>(Js::JavascriptProxy::HasItemQuery(unsigned_int)::__0,Js::JavascriptProxy::HasItemQuery(unsigned_int)::__1)::_lambda()_1_>
                           (pTVar5,(RecyclableObject *)function,ImplicitCall_Accessor,implicitCall);
        targetDescriptor._44_4_ = JavascriptConversion::ToBoolean(pvVar7,pSVar4);
        if (targetDescriptor._44_4_ == 0) {
          PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_c0);
          BVar2 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                            (object,propertyId_00,pSVar4,(PropertyDescriptor *)local_c0);
          if ((BVar2 != 0) &&
             ((bVar1 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_c0), !bVar1 ||
              (iVar3 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject[0x33])(), iVar3 == 0)))) {
            JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ea14,L"has");
          }
        }
        fn_local.index._4_4_ = targetDescriptor._44_4_;
      }
    }
  }
  return fn_local.index._4_4_;
}

Assistant:

BOOL JavascriptProxy::HasPropertyTrap(Fn fn, GetPropertyIdFunc getPropertyId)
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        // Caller does not pass requestContext. Retrieve from host scriptContext stack.
        ScriptContext* requestContext =
            threadContext->GetPreviousHostScriptContext()->GetScriptContext();

        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);

        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("has"));
        }

        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        JavascriptFunction* hasMethod = GetMethodHelper(PropertyIds::has, requestContext);

        if (nullptr == hasMethod || requestContext->IsHeapEnumInProgress())
        {
            return fn(targetObj);
        }

        PropertyId propertyId = getPropertyId();
        Var propertyName = GetName(requestContext, propertyId);

        Var getHasResult = threadContext->ExecuteImplicitCall(hasMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, hasMethod, CallInfo(CallFlags_Value, 3), handlerObj, targetObj, propertyName);
        });

        //9. Let booleanTrapResult be ToBoolean(trapResult).
        //10. ReturnIfAbrupt(booleanTrapResult).
        //11. If booleanTrapResult is false, then
        //    a.Let targetDesc be the result of calling the[[GetOwnProperty]] internal method of target with argument P.
        //    b.ReturnIfAbrupt(targetDesc).
        //    c.If targetDesc is not undefined, then
        //        i.If targetDesc.[[Configurable]] is false, then throw a TypeError exception.
        //        ii.Let extensibleTarget be the result of IsExtensible(target).
        //        iii.ReturnIfAbrupt(extensibleTarget).
        //        iv.If ToBoolean(extensibleTarget) is false, then throw a TypeError exception
        BOOL hasProperty = JavascriptConversion::ToBoolean(getHasResult, requestContext);
        if (!hasProperty)
        {
            PropertyDescriptor targetDescriptor;
            BOOL hasTargetProperty = JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, &targetDescriptor);
            if (hasTargetProperty)
            {
                if (!targetDescriptor.IsConfigurable() || !targetObj->IsExtensible())
                {
                    JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("has"));
                }
            }
        }
        return hasProperty;
    }